

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement_strings.cpp
# Opt level: O2

void __thiscall
MeasurementStrings_basicCast_Test::~MeasurementStrings_basicCast_Test
          (MeasurementStrings_basicCast_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(MeasurementStrings, basicCast)
{
    auto pm = measurement_cast_from_string("45 m");
    EXPECT_EQ(pm, 45.0 * m);

    pm = measurement_cast_from_string("9.0 * 5.0 m");
    EXPECT_EQ(pm, 45.0 * m);

    pm = measurement_cast_from_string("23.7 m/s");
    EXPECT_EQ(pm, 23.7 * m / s);
    EXPECT_EQ(pm, 23.7 * (m / s));
    pm = measurement_cast_from_string("99.9 N * m");
    EXPECT_EQ(pm, 99.9 * N * m);
    EXPECT_EQ(pm, 99.9 * (N * m));
}